

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BankAccount.cpp
# Opt level: O2

void __thiscall L13_2::BankAccount::withdraw(BankAccount *this,double amount)

{
  if (amount < 0.0) {
    std::operator<<((ostream *)&std::cout,"Withdraw failed. negative value(");
  }
  if (this->_balance < amount) {
    std::operator<<((ostream *)&std::cout,"Withdraw failed. not enough remaining balance.\n");
  }
  this->_balance = this->_balance - amount;
  return;
}

Assistant:

void BankAccount::withdraw(double amount) {
        if (amount < 0) {
            cout << "Withdraw failed. negative value(" << amount << ") not allowed.\n";
            return;
        }
        if (amount > _balance) {
            cout << "Withdraw failed. not enough remaining balance.\n";
            return;
        }
        _balance -= amount;
    }